

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

bool __thiscall flatbuffers::dart::DartGenerator::generate(DartGenerator *this)

{
  _Rb_tree_node_base *suffix;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  Parser *pPVar3;
  size_t __n;
  _Base_ptr __n_00;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  undefined8 *puVar7;
  long *plVar8;
  _Rb_tree_node_base *p_Var9;
  DartGenerator *pDVar10;
  size_type *psVar11;
  ulong *puVar12;
  ulong uVar13;
  undefined8 uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  string *included;
  pointer pIVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string import_code;
  namespace_code_map namespace_code;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  imports;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  DartGenerator *local_160;
  char *local_158;
  size_t local_150;
  char local_148;
  undefined7 uStack_147;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  long local_e8;
  size_type local_e0;
  long lStack_d8;
  string local_d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_158 = &local_148;
  local_150 = 0;
  local_148 = '\0';
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  GenerateEnums(this,(namespace_code_map *)&local_b0);
  GenerateStructs(this,(namespace_code_map *)&local_b0);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_160 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  Parser::GetIncludedFiles
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             local_118,(this->super_BaseGenerator).parser_);
  if (local_118._0_8_ != local_118._8_8_) {
    pDVar10 = local_160;
    included = (string *)(local_118._0_8_ + 0x20);
    do {
      pPVar3 = (pDVar10->super_BaseGenerator).parser_;
      __n = included->_M_string_length;
      if ((__n != (pPVar3->file_being_parsed_)._M_string_length) ||
         ((__n != 0 &&
          (iVar5 = bcmp((included->_M_dataplus)._M_p,(pPVar3->file_being_parsed_)._M_dataplus._M_p,
                        __n), pDVar10 = local_160, iVar5 != 0)))) {
        import_generator<flatbuffers::StructDef>
                  (local_160,&(pPVar3->structs_).vec,included,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_60);
        import_generator<flatbuffers::EnumDef>
                  (local_160,&(((local_160->super_BaseGenerator).parser_)->enums_).vec,included,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_60);
        pDVar10 = local_160;
      }
      pIVar16 = (pointer)(included + 1);
      included = included + 2;
    } while (pIVar16 != (pointer)local_118._8_8_);
  }
  std::vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_>::~vector
            ((vector<flatbuffers::IncludedFile,_std::allocator<flatbuffers::IncludedFile>_> *)
             local_118);
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"","");
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::__cxx11::string::_M_append(local_118,*(ulong *)(p_Var6 + 1));
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var2);
  }
  std::__cxx11::string::append(local_118);
  if ((_Rb_tree_header *)local_b0._M_impl.super__Rb_tree_header._M_header._M_left ==
      &local_b0._M_impl.super__Rb_tree_header) {
    bVar4 = true;
  }
  else {
    paVar1 = &local_1a0.field_2;
    p_Var6 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      paVar15 = &local_180.field_2;
      local_150 = 0;
      *local_158 = '\0';
      local_138 = &local_128;
      std::__cxx11::string::_M_construct<char*>((string *)&local_138,local_158,local_158);
      std::__cxx11::string::append((char *)&local_138);
      BaseGenerator::FlatBuffersGeneratedWarning();
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
      psVar11 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_180.field_2._M_allocated_capacity = *psVar11;
        local_180.field_2._8_8_ = puVar7[3];
        local_180._M_dataplus._M_p = (pointer)paVar15;
      }
      else {
        local_180.field_2._M_allocated_capacity = *psVar11;
        local_180._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_180._M_string_length = puVar7[1];
      *puVar7 = psVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_180);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1a0.field_2._M_allocated_capacity = *psVar11;
        local_1a0.field_2._8_8_ = plVar8[3];
        local_1a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1a0.field_2._M_allocated_capacity = *psVar11;
        local_1a0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_1a0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != paVar15) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,local_128 + 1);
      }
      local_1a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a0,local_158,local_158 + local_150);
      std::__cxx11::string::append((char *)&local_1a0);
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      local_f8._M_allocated_capacity = (size_type)(p_Var6 + 1);
      if (p_Var6[1]._M_parent != (_Base_ptr)0x0) {
        std::operator+(&local_180,"library ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_f8._M_allocated_capacity);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_180);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_1a0.field_2._M_allocated_capacity = *psVar11;
          local_1a0.field_2._8_8_ = plVar8[3];
          local_1a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar11;
          local_1a0._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_1a0._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar15) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)&local_158);
      std::operator+(&local_180,"import \'package:flat_buffers/flat_buffers.dart\' as ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &_kFb_abi_cxx11_);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_180);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1a0.field_2._M_allocated_capacity = *psVar11;
        local_1a0.field_2._8_8_ = plVar8[3];
        local_1a0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1a0.field_2._M_allocated_capacity = *psVar11;
        local_1a0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_1a0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      p_Var9 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != paVar15) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        p_Var9 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      for (; (_Rb_tree_header *)p_Var9 != &local_b0._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        suffix = p_Var9 + 1;
        __n_00 = p_Var9[1]._M_parent;
        if ((__n_00 != p_Var6[1]._M_parent) ||
           ((__n_00 != (_Base_ptr)0x0 &&
            (iVar5 = bcmp(*(void **)suffix,*(void **)local_f8._M_allocated_capacity,(size_t)__n_00),
            iVar5 != 0)))) {
          Filename(&local_80,local_160,(string *)suffix,false);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x366348);
          local_f8._8_8_ = &local_e0;
          psVar11 = (size_type *)(plVar8 + 2);
          if ((size_type *)*plVar8 == psVar11) {
            local_e0 = *psVar11;
            lStack_d8 = plVar8[3];
          }
          else {
            local_e0 = *psVar11;
            local_f8._8_8_ = (size_type *)*plVar8;
          }
          local_e8 = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_f8._M_local_buf + 8);
          puVar12 = (ulong *)(plVar8 + 2);
          if ((ulong *)*plVar8 == puVar12) {
            local_128 = *puVar12;
            lStack_120 = plVar8[3];
            local_138 = &local_128;
          }
          else {
            local_128 = *puVar12;
            local_138 = (ulong *)*plVar8;
          }
          local_130 = plVar8[1];
          *plVar8 = (long)puVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          ImportAliasName(&local_d0,(string *)suffix);
          uVar13 = 0xf;
          if (local_138 != &local_128) {
            uVar13 = local_128;
          }
          if (uVar13 < local_d0._M_string_length + local_130) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_d0 + 0x10U)) {
              uVar14 = local_d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_d0._M_string_length + local_130) goto LAB_001c5184;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_138);
          }
          else {
LAB_001c5184:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_138,(ulong)local_d0._M_dataplus._M_p);
          }
          psVar11 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_180.field_2._M_allocated_capacity = *psVar11;
            local_180.field_2._8_8_ = puVar7[3];
            local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar11;
            local_180._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_180._M_string_length = puVar7[1];
          *puVar7 = psVar11;
          puVar7[1] = 0;
          *(undefined1 *)psVar11 = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_180);
          psVar11 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_1a0.field_2._M_allocated_capacity = *psVar11;
            local_1a0.field_2._8_8_ = plVar8[3];
            local_1a0._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1a0.field_2._M_allocated_capacity = *psVar11;
            local_1a0._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_1a0._M_string_length = plVar8[1];
          *plVar8 = (long)psVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&local_d0 + 0x10U)) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128 + 1);
          }
          if ((size_type *)local_f8._8_8_ != &local_e0) {
            operator_delete((void *)local_f8._8_8_,local_e0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
      }
      std::__cxx11::string::append((char *)&local_158);
      std::__cxx11::string::_M_append((char *)&local_158,local_118._0_8_);
      std::__cxx11::string::_M_append((char *)&local_158,*(ulong *)(p_Var6 + 2));
      Filename(&local_1a0,local_160,(string *)local_f8._M_allocated_capacity,true);
      bVar4 = SaveFile(local_1a0._M_dataplus._M_p,local_158,local_150,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
    } while ((bVar4) &&
            (p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6),
            (_Rb_tree_header *)p_Var6 != &local_b0._M_impl.super__Rb_tree_header));
  }
  if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
    operator_delete((void *)local_118._0_8_,
                    (ulong)((long)&(((string *)local_118._16_8_)->_M_dataplus)._M_p + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0);
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
  }
  return bVar4;
}

Assistant:

bool generate() {
    std::string code;
    namespace_code_map namespace_code;
    GenerateEnums(namespace_code);
    GenerateStructs(namespace_code);

    std::set<std::string> imports;

    for (const auto &included_file : parser_.GetIncludedFiles()) {
      if (included_file.filename == parser_.file_being_parsed_) continue;

      import_generator(parser_.structs_.vec, included_file.filename, imports);
      import_generator(parser_.enums_.vec, included_file.filename, imports);
    }

    std::string import_code = "";
    for (const auto &file : imports) { import_code += file; }

    import_code += import_code.empty() ? "" : "\n";

    for (auto kv = namespace_code.begin(); kv != namespace_code.end(); ++kv) {
      code.clear();
      code = code + "// " + FlatBuffersGeneratedWarning() + "\n";
      code = code +
             "// ignore_for_file: unused_import, unused_field, unused_element, "
             "unused_local_variable\n\n";

      if (!kv->first.empty()) { code += "library " + kv->first + ";\n\n"; }

      code += "import 'dart:typed_data' show Uint8List;\n";
      code += "import 'package:flat_buffers/flat_buffers.dart' as " + _kFb +
              ";\n\n";

      for (auto kv2 = namespace_code.begin(); kv2 != namespace_code.end();
           ++kv2) {
        if (kv2->first != kv->first) {
          code += "import './" + Filename(kv2->first, /*path=*/false) +
                  "' as " + ImportAliasName(kv2->first) + ";\n";
        }
      }

      code += "\n";
      code += import_code;

      code += kv->second;

      if (!SaveFile(Filename(kv->first).c_str(), code, false)) { return false; }
    }
    return true;
  }